

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wav_header.cc
# Opt level: O3

bool webrtc::ReadWavHeader
               (ReadableWav *readable,size_t *num_channels,int *sample_rate,WavFormat *format,
               size_t *bytes_per_sample,size_t *num_samples)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar3;
  int16_t ext_size;
  WavHeader header;
  undefined4 *local_80;
  undefined8 local_78;
  undefined4 local_70;
  undefined1 local_6c;
  undefined4 local_5c;
  uint local_58;
  undefined4 local_54;
  undefined4 local_50;
  int local_4c;
  ushort local_48;
  ushort local_46;
  int local_44;
  int local_40;
  short local_3c;
  ushort local_3a;
  undefined4 local_38;
  uint local_34;
  
  iVar2 = (**readable->_vptr_ReadableWav)(readable,&local_5c,0x24);
  if ((CONCAT44(extraout_var,iVar2) == 0x24) &&
     (((local_4c == 0x10 ||
       (((local_4c == 0x12 &&
         (iVar2 = (**readable->_vptr_ReadableWav)(readable,&local_80,2),
         CONCAT44(extraout_var_01,iVar2) == 2)) && ((short)local_80 == 0)))) &&
      (iVar2 = (**readable->_vptr_ReadableWav)(readable,&local_38,8),
      CONCAT44(extraout_var_00,iVar2) == 8)))) {
    *format = (uint)local_48;
    *num_channels = (ulong)local_46;
    *sample_rate = local_44;
    *bytes_per_sample = (ulong)(local_3a >> 3);
    if (7 < local_3a) {
      *num_samples = (ulong)local_34 / (ulong)(local_3a >> 3);
      local_70 = local_5c;
      local_78 = 4;
      local_6c = 0;
      local_80 = &local_70;
      iVar2 = std::__cxx11::string::compare((char *)&local_80);
      if (local_80 != &local_70) {
        operator_delete(local_80);
      }
      if (iVar2 == 0) {
        local_80 = &local_70;
        local_70 = local_54;
        local_78 = 4;
        local_6c = 0;
        iVar2 = std::__cxx11::string::compare((char *)&local_80);
        if (local_80 != &local_70) {
          operator_delete(local_80);
        }
        if (iVar2 == 0) {
          local_80 = &local_70;
          local_70 = local_50;
          local_78 = 4;
          local_6c = 0;
          iVar2 = std::__cxx11::string::compare((char *)&local_80);
          if (local_80 != &local_70) {
            operator_delete(local_80);
          }
          if (iVar2 == 0) {
            local_80 = &local_70;
            local_70 = local_38;
            local_78 = 4;
            local_6c = 0;
            iVar2 = std::__cxx11::string::compare((char *)&local_80);
            if (local_80 != &local_70) {
              operator_delete(local_80);
            }
            if ((iVar2 == 0) && (local_34 + 0x24 <= local_58)) {
              lVar3 = *bytes_per_sample * *num_channels;
              if (local_40 != (int)lVar3 * *sample_rate) {
                return false;
              }
              if (local_3c != (short)lVar3) {
                return false;
              }
              bVar1 = CheckWavParameters(*num_channels,*sample_rate,*format,*bytes_per_sample,
                                         *num_samples);
              return bVar1;
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool ReadWavHeader(ReadableWav* readable,
                   size_t* num_channels,
                   int* sample_rate,
                   WavFormat* format,
                   size_t* bytes_per_sample,
                   size_t* num_samples) {
  WavHeader header;
  if (readable->Read(&header, kWavHeaderSize - sizeof(header.data)) !=
      kWavHeaderSize - sizeof(header.data))
    return false;

  const uint32_t fmt_size = ReadLE32(header.fmt.header.Size);
  if (fmt_size != kFmtSubchunkSize) {
    // There is an optional two-byte extension field permitted to be present
    // with PCM, but which must be zero.
    int16_t ext_size;
    if (kFmtSubchunkSize + sizeof(ext_size) != fmt_size)
      return false;
    if (readable->Read(&ext_size, sizeof(ext_size)) != sizeof(ext_size))
      return false;
    if (ext_size != 0)
      return false;
  }
  if (readable->Read(&header.data, sizeof(header.data)) != sizeof(header.data))
    return false;

  // Parse needed fields.
  *format = static_cast<WavFormat>(ReadLE16(header.fmt.AudioFormat));
  *num_channels = ReadLE16(header.fmt.NumChannels);
  *sample_rate = ReadLE32(header.fmt.SampleRate);
  *bytes_per_sample = ReadLE16(header.fmt.BitsPerSample) / 8;
  const size_t bytes_in_payload = ReadLE32(header.data.header.Size);
  if (*bytes_per_sample == 0)
    return false;
  *num_samples = bytes_in_payload / *bytes_per_sample;

  // Sanity check remaining fields.
  if (ReadFourCC(header.riff.header.ID) != "RIFF")
    return false;
  if (ReadFourCC(header.riff.Format) != "WAVE")
    return false;
  if (ReadFourCC(header.fmt.header.ID) != "fmt ")
    return false;
  if (ReadFourCC(header.data.header.ID) != "data")
    return false;

  if (ReadLE32(header.riff.header.Size) < RiffChunkSize(bytes_in_payload))
    return false;
  if (ReadLE32(header.fmt.ByteRate) !=
      ByteRate(*num_channels, *sample_rate, *bytes_per_sample))
    return false;
  if (ReadLE16(header.fmt.BlockAlign) !=
      BlockAlign(*num_channels, *bytes_per_sample))
    return false;

  return CheckWavParameters(*num_channels, *sample_rate, *format,
                            *bytes_per_sample, *num_samples);
}